

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::VariablePortHeaderSyntax::setChild
          (VariablePortHeaderSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00474020 + *(int *)(&DAT_00474020 + in_RSI * 4)))();
  return;
}

Assistant:

void VariablePortHeaderSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: constKeyword = child.token(); return;
        case 1: direction = child.token(); return;
        case 2: varKeyword = child.token(); return;
        case 3: dataType = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}